

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintPI(TidyDocImpl *doc,uint indent,Node *node)

{
  uint uVar1;
  bool bVar2;
  TidyAllocator *local_38;
  tmbstr s;
  TidyPrintImpl *pTStack_28;
  tchar c;
  TidyPrintImpl *pprint;
  Node *node_local;
  TidyDocImpl *pTStack_10;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  pTStack_28 = &doc->pprint;
  pprint = (TidyPrintImpl *)node;
  node_local._4_4_ = indent;
  pTStack_10 = doc;
  SetWrap(doc,indent);
  AddString(pTStack_28,"<?");
  local_38 = pprint[1].allocator;
  while( true ) {
    bVar2 = false;
    if (local_38 != (TidyAllocator *)0x0) {
      bVar2 = *(char *)&local_38->vtbl != '\0';
    }
    if (!bVar2) break;
    s._4_4_ = (uint)*(byte *)&local_38->vtbl;
    if (0x7f < s._4_4_) {
      uVar1 = prvTidyGetUTF8((ctmbstr)local_38,(uint *)((long)&s + 4));
      local_38 = (TidyAllocator *)((long)&local_38->vtbl + (ulong)uVar1);
    }
    AddChar(pTStack_28,s._4_4_);
    local_38 = (TidyAllocator *)((long)&local_38->vtbl + 1);
  }
  PPrintText(pTStack_10,0x10,node_local._4_4_,(Node *)pprint);
  if ((((int)(pTStack_10->config).value[100].v != 0) ||
      ((int)(pTStack_10->config).value[0x62].v != 0)) || (pprint[1].ixInd != 0)) {
    AddChar(pTStack_28,0x3f);
  }
  AddChar(pTStack_28,0x3e);
  PCondFlushLine(pTStack_10,node_local._4_4_);
  return;
}

Assistant:

static void PPrintPI( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    tchar c;
    tmbstr s;

    SetWrap( doc, indent );
    AddString( pprint, "<?" );

    s = node->element;

    while (s && *s)
    {
        c = (unsigned char)*s;
        if (c > 0x7F)
            s += TY_(GetUTF8)(s, &c);
        AddChar(pprint, c);
        ++s;
    }

    /* set CDATA to pass < and > unescaped */
    PPrintText( doc, CDATA, indent, node );

    if (cfgBool(doc, TidyXmlOut) ||
        cfgBool(doc, TidyXhtmlOut) || node->closed)
        AddChar( pprint, '?' );

    AddChar( pprint, '>' );
    PCondFlushLine( doc, indent );
}